

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::StencilTestInstance::iterate
          (TestStatus *__return_storage_ptr__,StencilTestInstance *this)

{
  VerticalFill *pVVar1;
  TestLog *log;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  VkResult VVar6;
  deUint32 queueFamilyIndex;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  VkQueue pVVar9;
  pointer pVVar10;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> cwVertices;
  TextureFormat tcuStencilFormat;
  TextureFormat tcuColorFormat;
  RenderState renderState;
  IVec3 local_3ec;
  UVec4 local_3e0;
  ColorVertexShader vertexShader;
  Program program;
  ColorFragmentShader fragmentShader;
  Vertex4RGBA cwVertex1;
  ReferenceRenderer refRenderer;
  VkSubmitInfo submitInfo;
  
  pDVar7 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar8 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar9 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&this->m_cmdBuffer;
  VVar6 = (*pDVar7->_vptr_DeviceInterface[0x14])(pDVar7,pVVar8,1,&this->m_fence);
  ::vk::checkResult(VVar6,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x37f);
  VVar6 = (*pDVar7->_vptr_DeviceInterface[2])
                    (pDVar7,pVVar9,1,&submitInfo,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar6,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x380);
  VVar6 = (*pDVar7->_vptr_DeviceInterface[0x16])
                    (pDVar7,pVVar8,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar6,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x381);
  tcuColorFormat = ::vk::mapVkFormat(this->m_colorFormat);
  tcuStencilFormat = ::vk::mapVkFormat(this->m_stencilFormat);
  rr::VertexShader::VertexShader(&vertexShader.super_VertexShader,2,2);
  vertexShader.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d20c80;
  *(undefined8 *)
   vertexShader.super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  (vertexShader.super_VertexShader.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  vertexShader.super_VertexShader.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_start[1].type = GENERICVECTYPE_FLOAT;
  ColorFragmentShader::ColorFragmentShader(&fragmentShader,&tcuColorFormat,&tcuStencilFormat);
  program.geometryShader = (GeometryShader *)0x0;
  program.vertexShader = &vertexShader.super_VertexShader;
  program.fragmentShader = &fragmentShader.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &tcuColorFormat,&tcuStencilFormat,&program);
  ReferenceRenderer::getViewportState(&refRenderer);
  renderState.cullMode = CULLMODE_NONE;
  renderState.provokingVertexConvention = PROVOKINGVERTEX_LAST;
  renderState.rasterization.winding = WINDING_CCW;
  renderState.rasterization.horizontalFill = FILL_LEFT;
  renderState.rasterization.verticalFill = FILL_BOTTOM;
  renderState.rasterization.viewportOrientation._0_2_ = VIEWPORTORIENTATION_LAST;
  renderState.rasterization.viewportOrientation._2_2_ = VIEWPORTORIENTATION_LOWER_LEFT >> 0x10;
  rr::FragmentOperationState::FragmentOperationState(&renderState.fragOps);
  renderState.point.pointSize = 1.0;
  renderState.viewport.rect.left = (int)cwVertex1.position.m_data[0];
  renderState.viewport.rect.bottom = (int)cwVertex1.position.m_data[1];
  renderState.viewport.rect.width = (int)cwVertex1.position.m_data[2];
  renderState.viewport.rect.height = (int)cwVertex1.position.m_data[3];
  renderState.viewport.zn = cwVertex1.color.m_data[0];
  renderState.viewport.zf = cwVertex1.color.m_data[1];
  renderState.line.lineWidth = 1.0;
  renderState.restart.enabled = false;
  renderState.restart.restartIndex = 0xffffffff;
  renderState.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  renderState.rasterization.viewportOrientation._0_2_ = VIEWPORTORIENTATION_LOWER_LEFT;
  renderState.rasterization.viewportOrientation._2_2_ = VIEWPORTORIENTATION_LOWER_LEFT >> 0x10;
  renderState.fragOps.depthTestEnabled = true;
  renderState.fragOps.depthFunc = mapVkCompareOp(VK_COMPARE_OP_LESS);
  renderState.fragOps.stencilTestEnabled = true;
  renderState.fragOps.stencilStates[0].sFail = mapVkStencilOp((this->m_stencilOpStateFront).failOp);
  renderState.fragOps.stencilStates[0].dpFail =
       mapVkStencilOp((this->m_stencilOpStateFront).depthFailOp);
  renderState.fragOps.stencilStates[0].dpPass = mapVkStencilOp((this->m_stencilOpStateFront).passOp)
  ;
  renderState.fragOps.stencilStates[0].func =
       mapVkCompareOp((this->m_stencilOpStateFront).compareOp);
  renderState.fragOps.stencilStates[1].sFail = mapVkStencilOp((this->m_stencilOpStateBack).failOp);
  renderState.fragOps.stencilStates[1].dpFail =
       mapVkStencilOp((this->m_stencilOpStateBack).depthFailOp);
  renderState.fragOps.stencilStates[1].dpPass = mapVkStencilOp((this->m_stencilOpStateBack).passOp);
  renderState.fragOps.stencilStates[1].func = mapVkCompareOp((this->m_stencilOpStateBack).compareOp)
  ;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (&cwVertices,&this->m_vertices);
  lVar11 = (long)cwVertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)cwVertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar11 != 2) {
    pVVar10 = cwVertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
    uVar12 = 0;
    do {
      cwVertex1.position.m_data._0_8_ = *(undefined8 *)pVVar10[-1].position.m_data;
      cwVertex1.position.m_data._8_8_ = *(undefined8 *)(pVVar10[-1].position.m_data + 2);
      cwVertex1.color.m_data._0_8_ = *(undefined8 *)pVVar10[-1].color.m_data;
      cwVertex1.color.m_data._8_8_ = *(undefined8 *)(pVVar10[-1].color.m_data + 2);
      uVar2 = *(undefined8 *)((pVVar10->position).m_data + 2);
      uVar3 = *(undefined8 *)(pVVar10->color).m_data;
      uVar4 = *(undefined8 *)((pVVar10->color).m_data + 2);
      *(undefined8 *)pVVar10[-1].position.m_data = *(undefined8 *)(pVVar10->position).m_data;
      *(undefined8 *)(pVVar10[-1].position.m_data + 2) = uVar2;
      *(undefined8 *)pVVar10[-1].color.m_data = uVar3;
      *(undefined8 *)(pVVar10[-1].color.m_data + 2) = uVar4;
      *(undefined8 *)(pVVar10->position).m_data = cwVertex1.position.m_data._0_8_;
      *(undefined8 *)((pVVar10->position).m_data + 2) = cwVertex1.position.m_data._8_8_;
      *(undefined8 *)(pVVar10->color).m_data = cwVertex1.color.m_data._0_8_;
      *(undefined8 *)((pVVar10->color).m_data + 2) = cwVertex1.color.m_data._8_8_;
      uVar12 = uVar12 + 3;
      pVVar10 = pVVar10 + 3;
    } while (uVar12 < lVar11 - 2U);
  }
  lVar11 = 0xc0;
  piVar13 = &DAT_00ae8824;
  do {
    renderState.fragOps.stencilStates[0].ref = piVar13[-3];
    renderState.fragOps.stencilStates[0].compMask = piVar13[-5];
    renderState.fragOps.stencilStates[0].writeMask = piVar13[-4];
    renderState.fragOps.stencilStates[1].ref = *piVar13;
    renderState.fragOps.stencilStates[1].compMask = piVar13[-2];
    renderState.fragOps.stencilStates[1].writeMask = piVar13[-1];
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &cwVertex1,
               (Vertex4RGBA *)
               ((long)cwVertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start[-6].position.m_data + lVar11),
               (Vertex4RGBA *)
               ((long)((cwVertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar11),
               (allocator_type *)&result);
    ReferenceRenderer::draw
              (&refRenderer,&renderState,PRIMITIVETYPE_TRIANGLES,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &cwVertex1);
    if (cwVertex1.position.m_data._0_8_ != 0) {
      operator_delete((void *)cwVertex1.position.m_data._0_8_,
                      cwVertex1.color.m_data._0_8_ - cwVertex1.position.m_data._0_8_);
    }
    lVar11 = lVar11 + 0xc0;
    piVar13 = piVar13 + 6;
  } while (lVar11 != 0x3c0);
  if (cwVertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cwVertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cwVertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cwVertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar7 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar8 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar9 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&cwVertex1,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)&renderState,pDVar7,pVVar8,
             (VkPhysicalDeviceMemoryProperties *)&cwVertex1);
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &cwVertex1,pDVar7,pVVar8,pVVar9,queueFamilyIndex,(Allocator *)&renderState,
                      (VkImage)(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)cwVertex1.position.m_data._0_8_;
  cwVertex1.position.m_data[0] = 0.0;
  cwVertex1.position.m_data[1] = 0.0;
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&cwVertex1);
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)&cwVertex1,&refRenderer);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&cwVertices,
             result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
             m_data.ptr);
  local_3e0.m_data[0] = 2;
  local_3e0.m_data[1] = 2;
  local_3e0.m_data[2] = 2;
  local_3e0.m_data[3] = 2;
  local_3ec.m_data[0] = 1;
  local_3ec.m_data[1] = 1;
  local_3ec.m_data[2] = 0;
  bVar5 = tcu::intThresholdPositionDeviationCompare
                    (log,"IntImageCompare","Image comparison",(ConstPixelBufferAccess *)&cwVertex1,
                     (ConstPixelBufferAccess *)&cwVertices,&local_3e0,&local_3ec,true,
                     COMPARE_LOG_RESULT);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  pVVar1 = &renderState.rasterization.verticalFill;
  renderState._0_8_ = pVVar1;
  if (bVar5) {
    cwVertex1.position.m_data[0] = 4.2039e-44;
    cwVertex1.position.m_data[1] = 0.0;
    renderState._0_8_ = std::__cxx11::string::_M_create((ulong *)&renderState,(ulong)&cwVertex1);
    renderState.rasterization.verticalFill = cwVertex1.position.m_data[0];
    renderState.rasterization.viewportOrientation._0_2_ = cwVertex1.position.m_data[1]._0_2_;
    renderState.rasterization.viewportOrientation._2_2_ = cwVertex1.position.m_data[1]._2_2_;
    builtin_strncpy((char *)renderState._0_8_,"Result image matches reference",0x1e);
    renderState.rasterization.winding = (Winding)cwVertex1.position.m_data[0];
    renderState.rasterization.horizontalFill = (HorizontalFill)cwVertex1.position.m_data[1];
    *(char *)(renderState._0_8_ + cwVertex1.position.m_data._0_8_) = '\0';
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,renderState._0_8_,
               (char *)(renderState._0_8_ + cwVertex1.position.m_data._0_8_));
  }
  else {
    renderState.rasterization.verticalFill = 0x67616d49;
    renderState.rasterization.viewportOrientation._0_2_ = 0x2065;
    renderState.rasterization.viewportOrientation._2_2_ = 0x696d;
    renderState.fragOps._0_6_ = 0x686374616d73;
    renderState.rasterization.winding = 0xe;
    renderState.rasterization.horizontalFill = FILL_LEFT;
    renderState.fragOps.scissorRectangle.left._2_1_ = 0;
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,pVVar1);
  }
  if ((VerticalFill *)renderState._0_8_ != pVVar1) {
    operator_delete((void *)renderState._0_8_,
                    CONCAT26(renderState.rasterization.viewportOrientation._2_2_,
                             CONCAT24((undefined2)renderState.rasterization.viewportOrientation,
                                      renderState.rasterization.verticalFill)) + 1);
  }
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus StencilTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity*/));

	return verifyImage();
}